

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::StringData> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::value::StringData>
          (optional<tinyusdz::value::StringData> *__return_storage_ptr__,MetaVariable *this)

{
  StringData *value;
  StringData *v;
  MetaVariable *this_local;
  
  value = tinyusdz::value::Value::as<tinyusdz::value::StringData>(&this->_value,false);
  if (value == (StringData *)0x0) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::optional(__return_storage_ptr__);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::
    optional<const_tinyusdz::value::StringData_&,_0>(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }